

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * __thiscall LowererMD::EnsureAdjacentArgs(LowererMD *this,Instr *instrArg)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  RegOpnd *pRVar7;
  Opnd *this_00;
  
  this_00 = instrArg->m_src2;
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1982,"(opnd)","opnd");
    if (!bVar3) goto LAB_005df225;
    *puVar4 = 0;
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  while (bVar3 = IR::Opnd::IsSymOpnd(this_00), bVar3) {
    pSVar5 = IR::Opnd::AsSymOpnd(this_00);
    pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
    pIVar1 = (pSVar6->field_5).m_instrDef;
    if (pIVar1 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1987,"(instrNextArg)","instrNextArg");
      if (!bVar3) goto LAB_005df225;
      *puVar4 = 0;
    }
    IR::Instr::SinkInstrBefore(pIVar1,instrArg);
    this_00 = pIVar1->m_src2;
    instrArg = pIVar1;
  }
  pRVar7 = IR::Opnd::AsRegOpnd(this_00);
  pIVar1 = (pRVar7->m_sym->field_5).m_instrDef;
  if ((pIVar1 == (Instr *)0x0) || (pIVar1->m_opcode != StartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x198e,"(instrNextArg && instrNextArg->m_opcode == Js::OpCode::StartCall)",
                       "instrNextArg && instrNextArg->m_opcode == Js::OpCode::StartCall");
    if (!bVar3) {
LAB_005df225:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (pIVar1->m_next != instrArg) {
    IR::Instr::UnlinkStartCallFromBailOutInfo(pIVar1,instrArg);
    IR::Instr::Unlink(pIVar1);
    IR::Instr::InsertBefore(instrArg,pIVar1);
  }
  return pIVar1->m_prev;
}

Assistant:

IR::Instr *
LowererMD::EnsureAdjacentArgs(IR::Instr * instrArg)
{
    // Ensure that the arg instructions for a given call site are adjacent.
    // This isn't normally desirable for CQ, but it's required by, for instance, the cloner,
    // which must clone a complete call sequence.
    IR::Opnd * opnd = instrArg->GetSrc2();
    IR::Instr * instrNextArg;
    StackSym * sym;

    AssertMsg(opnd, "opnd");
    while (opnd->IsSymOpnd())
    {
        sym = opnd->AsSymOpnd()->m_sym->AsStackSym();
        instrNextArg = sym->m_instrDef;
        Assert(instrNextArg);
        instrNextArg->SinkInstrBefore(instrArg);
        instrArg = instrNextArg;
        opnd = instrArg->GetSrc2();
    }
    sym = opnd->AsRegOpnd()->m_sym;
    instrNextArg = sym->m_instrDef;
    Assert(instrNextArg && instrNextArg->m_opcode == Js::OpCode::StartCall);

    // The StartCall can be trivially moved down.
    if (instrNextArg->m_next != instrArg)
    {
        instrNextArg->UnlinkStartCallFromBailOutInfo(instrArg);
        instrNextArg->Unlink();
        instrArg->InsertBefore(instrNextArg);
    }

    return instrNextArg->m_prev;
}